

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O0

void __thiscall
btRigidBody::setupRigidBody(btRigidBody *this,btRigidBodyConstructionInfo *constructionInfo)

{
  long *plVar1;
  int iVar2;
  btRigidBody *in_RSI;
  btTransform *in_RDI;
  btVector3 bVar3;
  btTransform *in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff68 [16];
  btScalar local_88;
  btScalar local_84;
  btScalar local_80;
  btScalar local_7c;
  btScalar local_78;
  btScalar local_74;
  btScalar local_70;
  btScalar local_6c;
  btScalar local_68;
  btScalar local_64;
  btScalar bVar4;
  btScalar bVar5;
  btScalar local_58;
  btScalar mass;
  btScalar bVar6;
  btScalar bVar7;
  btScalar local_48;
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  btScalar local_38;
  btScalar local_34;
  btScalar local_30;
  btScalar local_2c;
  btScalar local_28;
  btScalar local_24;
  btScalar local_20;
  btScalar local_1c;
  btScalar local_18;
  btScalar local_14;
  
  in_RDI[4].m_basis.m_el[0].m_floats[0] = 2.8026e-45;
  local_14 = 0.0;
  local_18 = 0.0;
  local_1c = 0.0;
  btVector3::setValue((btVector3 *)(in_RDI[5].m_origin.m_floats + 3),&local_14,&local_18,&local_1c);
  local_20 = 0.0;
  local_24 = 0.0;
  local_28 = 0.0;
  btVector3::setValue((btVector3 *)(in_RDI[6].m_basis.m_el[0].m_floats + 3),&local_20,&local_24,
                      &local_28);
  local_2c = 1.0;
  local_30 = 1.0;
  local_34 = 1.0;
  btVector3::setValue((btVector3 *)(in_RDI[9].m_origin.m_floats + 2),&local_2c,&local_30,&local_34);
  local_38 = 1.0;
  local_3c = 1.0;
  local_40 = 1.0;
  btVector3::setValue(in_RDI[6].m_basis.m_el + 2,&local_38,&local_3c,&local_40);
  local_44 = 0.0;
  local_48 = 0.0;
  bVar7 = 0.0;
  btVector3::setValue(&in_RDI[6].m_origin,&local_44,&local_48,(btScalar *)&stack0xffffffffffffffb4);
  bVar6 = 0.0;
  mass = 0.0;
  local_58 = 0.0;
  btVector3::setValue((btVector3 *)(in_RDI + 7),(btScalar *)&stack0xffffffffffffffb0,
                      (btScalar *)&stack0xffffffffffffffac,&local_58);
  bVar5 = 0.0;
  bVar4 = 0.0;
  local_64 = 0.0;
  btVector3::setValue(in_RDI[7].m_basis.m_el + 2,(btScalar *)&stack0xffffffffffffffa4,
                      (btScalar *)&stack0xffffffffffffffa0,&local_64);
  local_68 = 0.0;
  local_6c = 0.0;
  local_70 = 0.0;
  btVector3::setValue(&in_RDI[7].m_origin,&local_68,&local_6c,&local_70);
  setDamping(in_stack_ffffffffffffff68._8_8_,in_stack_ffffffffffffff68._4_4_,
             in_stack_ffffffffffffff68._0_4_);
  in_RDI[8].m_basis.m_el[1].m_floats[3] =
       (in_RSI->super_btCollisionObject).m_interpolationWorldTransform.m_origin.m_floats[1];
  in_RDI[8].m_basis.m_el[2].m_floats[0] =
       (in_RSI->super_btCollisionObject).m_interpolationWorldTransform.m_origin.m_floats[2];
  *(undefined8 *)(in_RDI[8].m_basis.m_el[2].m_floats + 2) =
       *(undefined8 *)(in_RSI->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats;
  in_RDI[10].m_origin.m_floats[2] = 0.0;
  in_RDI[10].m_origin.m_floats[3] = 0.0;
  *(byte *)(in_RDI[8].m_basis.m_el[0].m_floats + 2) =
       *(byte *)((in_RSI->super_btCollisionObject).m_interpolationWorldTransform.m_origin.m_floats +
                3) & 1;
  in_RDI[8].m_basis.m_el[0].m_floats[3] =
       (in_RSI->super_btCollisionObject).m_interpolationLinearVelocity.m_floats[0];
  in_RDI[8].m_basis.m_el[1].m_floats[0] =
       (in_RSI->super_btCollisionObject).m_interpolationLinearVelocity.m_floats[1];
  in_RDI[8].m_basis.m_el[1].m_floats[1] =
       (in_RSI->super_btCollisionObject).m_interpolationLinearVelocity.m_floats[2];
  in_RDI[8].m_basis.m_el[1].m_floats[2] =
       (in_RSI->super_btCollisionObject).m_interpolationLinearVelocity.m_floats[3];
  if (*(long *)(in_RDI[8].m_basis.m_el[2].m_floats + 2) == 0) {
    btTransform::operator=(in_RDI,in_stack_ffffffffffffff58);
  }
  else {
    plVar1 = *(long **)(in_RDI[8].m_basis.m_el[2].m_floats + 2);
    (**(code **)(*plVar1 + 0x10))(plVar1,(in_RDI->m_basis).m_el[0].m_floats + 2);
  }
  btTransform::operator=(in_RDI,in_stack_ffffffffffffff58);
  local_74 = 0.0;
  local_78 = 0.0;
  local_7c = 0.0;
  btVector3::setValue((btVector3 *)(in_RDI[2].m_basis.m_el[0].m_floats + 2),&local_74,&local_78,
                      &local_7c);
  local_80 = 0.0;
  local_84 = 0.0;
  local_88 = 0.0;
  btVector3::setValue((btVector3 *)(in_RDI[2].m_basis.m_el[1].m_floats + 2),&local_80,&local_84,
                      &local_88);
  in_RDI[3].m_origin.m_floats[1] =
       (in_RSI->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[2].m_floats[2];
  in_RDI[3].m_origin.m_floats[3] =
       (in_RSI->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[2].m_floats[3];
  in_RDI[3].m_origin.m_floats[2] =
       (in_RSI->super_btCollisionObject).m_interpolationWorldTransform.m_origin.m_floats[0];
  (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0x10))
            (in_RDI,*(undefined8 *)
                     ((in_RSI->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el
                      [0].m_floats + 2));
  iVar2 = uniqueId + 1;
  in_RDI[9].m_basis.m_el[1].m_floats[1] = (btScalar)uniqueId;
  uniqueId = iVar2;
  setMassProps((btRigidBody *)CONCAT44(bVar7,bVar6),mass,(btVector3 *)CONCAT44(bVar5,bVar4));
  updateInertiaTensor(in_RSI);
  in_RDI[9].m_basis.m_el[1].m_floats[0] = 1.12104e-44;
  btVector3::setZero((btVector3 *)in_RDI);
  btVector3::setZero((btVector3 *)in_RDI);
  bVar3 = ::operator*((btScalar *)in_RDI,(btVector3 *)in_stack_ffffffffffffff58);
  *(long *)(in_RDI[10].m_basis.m_el[0].m_floats + 2) = bVar3.m_floats._0_8_;
  *(long *)in_RDI[10].m_basis.m_el[1].m_floats = bVar3.m_floats._8_8_;
  btVector3::setZero((btVector3 *)in_RDI);
  btVector3::setZero((btVector3 *)in_RDI);
  return;
}

Assistant:

void	btRigidBody::setupRigidBody(const btRigidBody::btRigidBodyConstructionInfo& constructionInfo)
{

	m_internalType=CO_RIGID_BODY;

	m_linearVelocity.setValue(btScalar(0.0), btScalar(0.0), btScalar(0.0));
	m_angularVelocity.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
	m_angularFactor.setValue(1,1,1);
	m_linearFactor.setValue(1,1,1);
	m_gravity.setValue(btScalar(0.0), btScalar(0.0), btScalar(0.0));
	m_gravity_acceleration.setValue(btScalar(0.0), btScalar(0.0), btScalar(0.0));
	m_totalForce.setValue(btScalar(0.0), btScalar(0.0), btScalar(0.0));
	m_totalTorque.setValue(btScalar(0.0), btScalar(0.0), btScalar(0.0)),
    setDamping(constructionInfo.m_linearDamping, constructionInfo.m_angularDamping);

	m_linearSleepingThreshold = constructionInfo.m_linearSleepingThreshold;
	m_angularSleepingThreshold = constructionInfo.m_angularSleepingThreshold;
	m_optionalMotionState = constructionInfo.m_motionState;
	m_contactSolverType = 0;
	m_frictionSolverType = 0;
	m_additionalDamping = constructionInfo.m_additionalDamping;
	m_additionalDampingFactor = constructionInfo.m_additionalDampingFactor;
	m_additionalLinearDampingThresholdSqr = constructionInfo.m_additionalLinearDampingThresholdSqr;
	m_additionalAngularDampingThresholdSqr = constructionInfo.m_additionalAngularDampingThresholdSqr;
	m_additionalAngularDampingFactor = constructionInfo.m_additionalAngularDampingFactor;

	if (m_optionalMotionState)
	{
		m_optionalMotionState->getWorldTransform(m_worldTransform);
	} else
	{
		m_worldTransform = constructionInfo.m_startWorldTransform;
	}

	m_interpolationWorldTransform = m_worldTransform;
	m_interpolationLinearVelocity.setValue(0,0,0);
	m_interpolationAngularVelocity.setValue(0,0,0);
	
	//moved to btCollisionObject
	m_friction = constructionInfo.m_friction;
	m_rollingFriction = constructionInfo.m_rollingFriction;
	m_restitution = constructionInfo.m_restitution;

	setCollisionShape( constructionInfo.m_collisionShape );
	m_debugBodyId = uniqueId++;
	
	setMassProps(constructionInfo.m_mass, constructionInfo.m_localInertia);
	updateInertiaTensor();

	m_rigidbodyFlags = BT_ENABLE_GYROSCOPIC_FORCE_IMPLICIT_BODY;


	m_deltaLinearVelocity.setZero();
	m_deltaAngularVelocity.setZero();
	m_invMass = m_inverseMass*m_linearFactor;
	m_pushVelocity.setZero();
	m_turnVelocity.setZero();

	

}